

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall kj::UnixEventPort::preparePollableFdForSleep(UnixEventPort *this)

{
  bool bVar1;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> MVar2;
  TimerImpl local_70;
  Fault f;
  SignalPromiseAdapter **local_40;
  undefined1 local_38 [8];
  DebugComparison<kj::UnixEventPort::SignalPromiseAdapter_*&,_std::nullptr_t> _kjCondition;
  UnixEventPort *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (SignalPromiseAdapter **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->signalHead);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<kj::UnixEventPort::SignalPromiseAdapter*&>::operator==
            ((DebugComparison<kj::UnixEventPort::SignalPromiseAdapter_*&,_std::nullptr_t> *)local_38
             ,(DebugExpression<kj::UnixEventPort::SignalPromiseAdapter*&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::UnixEventPort::SignalPromiseAdapter*&,decltype(nullptr)>&,char_const(&)[68]>
              ((Fault *)&local_70.sleepHooks,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x2e1,FAILED,"signalHead == nullptr",
               "_kjCondition,\"preparePollableFdForSleep() cannot be used when waiting for signals\""
               ,(DebugComparison<kj::UnixEventPort::SignalPromiseAdapter_*&,_std::nullptr_t> *)
                local_38,
               (char (*) [68])"preparePollableFdForSleep() cannot be used when waiting for signals")
    ;
    kj::_::Debug::Fault::fatal((Fault *)&local_70.sleepHooks);
  }
  if ((this->runnable & 1U) == 0) {
    MVar2 = TimerImpl::nextEvent(&local_70);
    (*(this->super_EventPort)._vptr_EventPort[4])(this,&local_70,MVar2.ptr.field_1);
    Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>::~Maybe
              ((Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_> *
               )&local_70);
    this->sleeping = true;
    TimerImpl::setSleeping(&this->timerImpl,&this->super_SleepHooks);
  }
  else {
    (*(this->super_EventPort)._vptr_EventPort[3])();
  }
  return;
}

Assistant:

void UnixEventPort::preparePollableFdForSleep() {
  KJ_ASSERT(signalHead == nullptr,
      "preparePollableFdForSleep() cannot be used when waiting for signals");

  if (runnable) {
    // There is still immediate work in the queue, so force the epoll to be ready immediately. (See
    // comments in setRunnable() regarding using wake() for this.)
    wake();
  } else {
    updateNextTimerEvent(timerImpl.nextEvent());

    // Flag that we're sleeping, so setRunnable() knows to use wake() if needed.
    sleeping = true;

    // Tell the timer we're sleeping, so that it notifies us if anyone tries to create a new time
    // event.
    timerImpl.setSleeping(*this);
  }
}